

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O3

void set_block_size(AV1_COMP *cpi,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  MB_MODE_INFO *pMVar1;
  int iVar2;
  
  if ((mi_col < (cpi->common).mi_params.mi_cols) && (mi_row < (cpi->common).mi_params.mi_rows)) {
    iVar2 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [(cpi->common).mi_params.mi_alloc_bsize]) *
            (cpi->common).mi_params.mi_alloc_stride +
            mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    pMVar1 = (cpi->common).mi_params.mi_alloc;
    (cpi->common).mi_params.mi_grid_base[(cpi->common).mi_params.mi_stride * mi_row + mi_col] =
         pMVar1 + iVar2;
    pMVar1[iVar2].bsize = bsize;
  }
  return;
}

Assistant:

static inline void set_block_size(AV1_COMP *const cpi, int mi_row, int mi_col,
                                  BLOCK_SIZE bsize) {
  if (cpi->common.mi_params.mi_cols > mi_col &&
      cpi->common.mi_params.mi_rows > mi_row) {
    CommonModeInfoParams *mi_params = &cpi->common.mi_params;
    const int mi_grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
    const int mi_alloc_idx = get_alloc_mi_idx(mi_params, mi_row, mi_col);
    MB_MODE_INFO *mi = mi_params->mi_grid_base[mi_grid_idx] =
        &mi_params->mi_alloc[mi_alloc_idx];
    mi->bsize = bsize;
  }
}